

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O2

void __thiscall antlr::LexerInputState::initialize(LexerInputState *this,istream *in,char *file)

{
  CharBuffer *this_00;
  
  this->column = 1;
  this->line = 1;
  this->tokenStartColumn = 1;
  this->tokenStartLine = 1;
  this->guessing = 0;
  std::__cxx11::string::assign((char *)&this->filename);
  if ((this->input != (InputBuffer *)0x0) && (this->inputResponsible == true)) {
    (*this->input->_vptr_InputBuffer[1])();
  }
  this_00 = (CharBuffer *)operator_new(0x40);
  CharBuffer::CharBuffer(this_00,in);
  this->input = (InputBuffer *)this_00;
  this->inputResponsible = true;
  return;
}

Assistant:

virtual void initialize( ANTLR_USE_NAMESPACE(std)istream& in, const char* file = "" )
	{
		column = 1;
		line = 1;
		tokenStartColumn = 1;
		tokenStartLine = 1;
		guessing = 0;
		filename = file;

		if( input && inputResponsible )
			delete input;

		input = new CharBuffer(in);
		inputResponsible = true;
	}